

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_CCtx_loadDictionary_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_customMem customMem;
  void *__dest;
  int in_ECX;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  void *dictBuffer;
  undefined8 in_stack_ffffffffffffffb0;
  ZSTD_CCtx *in_stack_ffffffffffffffc0;
  size_t local_8;
  
  if (*(int *)(in_RDI + 0xe18) == 0) {
    ZSTD_clearAllDicts(in_stack_ffffffffffffffc0);
    if ((in_RSI == (void *)0x0) || (in_RDX == 0)) {
      local_8 = 0;
    }
    else {
      if (in_ECX == 1) {
        *(void **)(in_RDI + 0xe50) = in_RSI;
      }
      else {
        if (*(long *)(in_RDI + 0x388) != 0) {
          return 0xffffffffffffffc0;
        }
        customMem.customFree = (ZSTD_freeFunction)*(size_t *)(in_RDI + 0x368);
        customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffb0;
        customMem.opaque = *(void **)(in_RDI + 0x370);
        __dest = ZSTD_customMalloc(*(size_t *)(in_RDI + 0x368),customMem);
        if (__dest == (void *)0x0) {
          return 0xffffffffffffffc0;
        }
        memcpy(__dest,in_RSI,in_RDX);
        *(void **)(in_RDI + 0xe48) = __dest;
        *(void **)(in_RDI + 0xe50) = __dest;
      }
      *(size_t *)(in_RDI + 0xe58) = in_RDX;
      *(undefined4 *)(in_RDI + 0xe60) = in_R8D;
      local_8 = 0;
    }
  }
  else {
    local_8 = 0xffffffffffffffc4;
  }
  return local_8;
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_advanced(
        ZSTD_CCtx* cctx,
        const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod,
        ZSTD_dictContentType_e dictContentType)
{
    DEBUGLOG(4, "ZSTD_CCtx_loadDictionary_advanced (size: %u)", (U32)dictSize);
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                    "Can't load a dictionary when cctx is not in init stage.");
    ZSTD_clearAllDicts(cctx);  /* erase any previously set dictionary */
    if (dict == NULL || dictSize == 0)  /* no dictionary */
        return 0;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
        cctx->localDict.dict = dict;
    } else {
        /* copy dictionary content inside CCtx to own its lifetime */
        void* dictBuffer;
        RETURN_ERROR_IF(cctx->staticSize, memory_allocation,
                        "static CCtx can't allocate for an internal copy of dictionary");
        dictBuffer = ZSTD_customMalloc(dictSize, cctx->customMem);
        RETURN_ERROR_IF(dictBuffer==NULL, memory_allocation,
                        "allocation failed for dictionary content");
        ZSTD_memcpy(dictBuffer, dict, dictSize);
        cctx->localDict.dictBuffer = dictBuffer;  /* owned ptr to free */
        cctx->localDict.dict = dictBuffer;        /* read-only reference */
    }
    cctx->localDict.dictSize = dictSize;
    cctx->localDict.dictContentType = dictContentType;
    return 0;
}